

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

bool __thiscall QMakeSourceFileInfo::isSystemInclude(QMakeSourceFileInfo *this,QString *name)

{
  bool bVar1;
  ulong uVar2;
  QString *this_00;
  qsizetype qVar3;
  const_reference pQVar4;
  char *pcVar5;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  QString relativePath;
  QDir systemDir;
  qsizetype in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  QString *in_stack_ffffffffffffff48;
  byte local_a9;
  int local_94;
  int local_8c;
  byte local_71;
  undefined1 local_40 [24];
  undefined8 local_28;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QDir::isRelativePath((QString *)in_RSI);
  if ((uVar2 & 1) == 0) {
    local_8c = 0;
    while( true ) {
      this_00 = (QString *)(long)local_8c;
      qVar3 = QList<QString>::size((QList<QString> *)(in_RDI + 0x38));
      if (qVar3 <= (long)this_00) break;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      pQVar4 = QList<QString>::at((QList<QString> *)
                                  CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                                  in_stack_ffffffffffffff38);
      QDir::QDir((QDir *)&local_10,(QString *)pQVar4);
      local_28 = 0xaaaaaaaaaaaaaaaa;
      QDir::relativeFilePath((QString *)&local_28);
      bVar1 = QDir::isAbsolutePath((QString *)0x1d3751);
      local_a9 = 1;
      if (!bVar1) {
        QString::QString(in_stack_ffffffffffffff48,(char *)in_RSI);
        local_a9 = QString::startsWith((QString *)&local_28,(CaseSensitivity)local_40);
        QString::~QString((QString *)0x1d37b8);
      }
      if ((local_a9 & 1) == 0) {
        if (Option::debug_level != 0) {
          QtPrivate::asString(in_RSI);
          QString::toLocal8Bit(this_00);
          in_stack_ffffffffffffff48 = (QString *)QByteArray::constData((QByteArray *)0x1d3800);
          pQVar4 = QList<QString>::at((QList<QString> *)
                                      CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                                      in_stack_ffffffffffffff38);
          QtPrivate::asString(pQVar4);
          QString::toLocal8Bit(this_00);
          pcVar5 = QByteArray::constData((QByteArray *)0x1d3837);
          debug_msg_internal(5,"File/dir %s is in system dir %s, skipping",in_stack_ffffffffffffff48
                             ,pcVar5);
          QByteArray::~QByteArray((QByteArray *)0x1d385c);
          QByteArray::~QByteArray((QByteArray *)0x1d3866);
        }
        local_71 = 1;
        local_94 = 1;
      }
      else {
        local_94 = 4;
      }
      QString::~QString((QString *)0x1d3880);
      QDir::~QDir((QDir *)&local_10);
      if (local_94 == 1) goto LAB_001d38ad;
      local_8c = local_8c + 1;
    }
    local_71 = 0;
  }
  else {
    local_71 = 0;
  }
LAB_001d38ad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_71 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeSourceFileInfo::isSystemInclude(const QString &name)
{
    if (QDir::isRelativePath(name)) {
        // if we got a relative path here, it's either an -I flag with a relative path
        // or an include file we couldn't locate. Either way, conclude it's not
        // a system include.
        return false;
    }

    for (int i = 0; i < systemIncludes.size(); ++i) {
        // check if name is located inside the system include dir:
        QDir systemDir(systemIncludes.at(i));
        QString relativePath = systemDir.relativeFilePath(name);

        // the relative path might be absolute if we're crossing drives on Windows
        if (QDir::isAbsolutePath(relativePath) || relativePath.startsWith("../"))
            continue;
        debug_msg(5, "File/dir %s is in system dir %s, skipping",
                  qPrintable(name), qPrintable(systemIncludes.at(i)));
        return true;
    }
    return false;
}